

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O2

float stbtt__position_trapezoid_area(float height,float tx0,float tx1,float bx0,float bx1)

{
  if (tx1 - tx0 < 0.0) {
    __assert_fail("top_width >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imstb_truetype.h"
                  ,0xc00,"float stbtt__sized_trapezoid_area(float, float, float)");
  }
  if (0.0 <= bx1 - bx0) {
    return ((tx1 - tx0) + (bx1 - bx0)) * 0.5 * height;
  }
  __assert_fail("bottom_width >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imstb_truetype.h"
                ,0xc01,"float stbtt__sized_trapezoid_area(float, float, float)");
}

Assistant:

static float stbtt__position_trapezoid_area(float height, float tx0, float tx1, float bx0, float bx1)
{
   return stbtt__sized_trapezoid_area(height, tx1 - tx0, bx1 - bx0);
}